

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hw_identifier_facade.cpp
# Opt level: O0

LCC_EVENT_TYPE license::hw_identifier::HwIdentifierFacade::validate_pc_signature(string *str_code)

{
  LCC_EVENT_TYPE LVar1;
  pointer pIVar2;
  logic_error *e;
  unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
  strategy;
  LCC_API_HW_IDENTIFICATION_STRATEGY id_strategy;
  undefined1 local_28 [8];
  HwIdentifier pc_id;
  LCC_EVENT_TYPE result;
  string *str_code_local;
  
  pc_id.m_data._M_elems[4] = '\t';
  pc_id.m_data._M_elems[5] = '\0';
  pc_id.m_data._M_elems[6] = '\0';
  pc_id.m_data._M_elems[7] = '\0';
  HwIdentifier::HwIdentifier((HwIdentifier *)local_28,str_code);
  strategy._M_t.
  super___uniq_ptr_impl<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
  ._M_t.
  super__Tuple_impl<0UL,_license::hw_identifier::IdentificationStrategy_*,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
  .super__Head_base<0UL,_license::hw_identifier::IdentificationStrategy_*,_false>._M_head_impl._0_4_
       = HwIdentifier::get_identification_strategy((HwIdentifier *)local_28);
  IdentificationStrategy::get_strategy
            ((IdentificationStrategy *)&e,
             (LCC_API_HW_IDENTIFICATION_STRATEGY)
             strategy._M_t.
             super___uniq_ptr_impl<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
             ._M_t.
             super__Tuple_impl<0UL,_license::hw_identifier::IdentificationStrategy_*,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
             .super__Head_base<0UL,_license::hw_identifier::IdentificationStrategy_*,_false>.
             _M_head_impl);
  pIVar2 = std::
           unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
           ::operator->((unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
                         *)&e);
  pc_id.m_data._M_elems._4_4_ = (*pIVar2->_vptr_IdentificationStrategy[5])(pIVar2,local_28);
  std::
  unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
  ::~unique_ptr((unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
                 *)&e);
  HwIdentifier::~HwIdentifier((HwIdentifier *)local_28);
  LVar1._0_1_ = pc_id.m_data._M_elems[4];
  LVar1._1_1_ = pc_id.m_data._M_elems[5];
  LVar1._2_1_ = pc_id.m_data._M_elems[6];
  LVar1._3_1_ = pc_id.m_data._M_elems[7];
  return LVar1;
}

Assistant:

LCC_EVENT_TYPE HwIdentifierFacade::validate_pc_signature(const std::string& str_code) {
	LCC_EVENT_TYPE result = IDENTIFIERS_MISMATCH;
	try {
        HwIdentifier pc_id(str_code);
        LCC_API_HW_IDENTIFICATION_STRATEGY id_strategy = pc_id.get_identification_strategy();
		unique_ptr<IdentificationStrategy> strategy = IdentificationStrategy::get_strategy(id_strategy);
		result = strategy->validate_identifier(pc_id);
	} catch (logic_error& e) {
		LOG_ERROR("Error validating identifier %s: %s", str_code.c_str(), e.what());
		((void)(e));
	}
	return result;
}